

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

bool __thiscall
Assimp::FBX::FBXConverter::NeedsComplexTransformationChain(FBXConverter *this,Model *model)

{
  PropertyTable *in;
  char *__s;
  ulong uVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar2;
  aiVector3t<float> aVar3;
  bool ok;
  bool local_6e;
  allocator<char> local_6d;
  float local_6c;
  undefined1 local_68 [24];
  
  in = Model::Props(model);
  for (uVar1 = 0; uVar1 != 0x11; uVar1 = uVar1 + 1) {
    if (((TransformationComp)uVar1 &
        (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) !=
        TransformationComp_Translation && uVar1 != 0xc) {
      __s = NameTransformationCompProperty((FBXConverter *)model,(TransformationComp)uVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffb0,__s,&local_6d);
      aVar3 = PropertyGet<aiVector3t<float>>(in,(string *)&stack0xffffffffffffffb0,&local_6e,false);
      local_6c = aVar3.z;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = aVar3._0_8_;
      local_68._12_4_ = extraout_XMM0_Dd;
      model = (Model *)&stack0xffffffffffffffb0;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      if (local_6e == true && uVar1 == 0x10) {
        fVar2 = (local_6c + -1.0) * (local_6c + -1.0) +
                ((float)local_68._0_4_ + -1.0) * ((float)local_68._0_4_ + -1.0) +
                ((float)local_68._4_4_ + -1.0) * ((float)local_68._4_4_ + -1.0);
      }
      else {
        if (local_6e == false) goto LAB_004f9b7c;
        fVar2 = local_6c * local_6c +
                (float)local_68._0_4_ * (float)local_68._0_4_ +
                (float)local_68._4_4_ * (float)local_68._4_4_;
      }
      if (1e-06 < fVar2) break;
    }
LAB_004f9b7c:
  }
  return uVar1 < 0x11;
}

Assistant:

bool FBXConverter::NeedsComplexTransformationChain(const Model& model)
        {
            const PropertyTable& props = model.Props();
            bool ok;

            const float zero_epsilon = 1e-6f;
            const aiVector3D all_ones(1.0f, 1.0f, 1.0f);
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (comp == TransformationComp_Rotation || comp == TransformationComp_Scaling || comp == TransformationComp_Translation) {
                    continue;
                }

                bool scale_compare = (comp == TransformationComp_GeometricScaling || comp == TransformationComp_Scaling);

                const aiVector3D& v = PropertyGet<aiVector3D>(props, NameTransformationCompProperty(comp), ok);
                if (ok && scale_compare) {
                    if ((v - all_ones).SquareLength() > zero_epsilon) {
                        return true;
                    }
                } else if (ok) {
                    if (v.SquareLength() > zero_epsilon) {
                        return true;
                    }
                }
            }

            return false;
        }